

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPool::startOnReservedThread(QThreadPool *this,QRunnable *runnable)

{
  long lVar1;
  undefined1 uVar2;
  QThreadPoolPrivate *this_00;
  long in_RSI;
  long in_FS_OFFSET;
  QRunnable *in_stack_00000010;
  QThreadPoolPrivate *in_stack_00000018;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QRunnable *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    releaseThread((QThreadPool *)in_stack_ffffffffffffffc8);
  }
  else {
    this_00 = d_func((QThreadPool *)0x6ccaeb);
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
               ,in_stack_ffffffffffffffa8);
    this_00->reservedThreads = this_00->reservedThreads + -1;
    uVar2 = QThreadPoolPrivate::tryStart(this_00,in_stack_ffffffffffffffc8);
    if (!(bool)uVar2) {
      QThreadPoolPrivate::enqueueTask(in_stack_00000018,in_stack_00000010,locker._12_4_);
    }
    QMutexLocker<QMutex>::~QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT17(uVar2,in_stack_ffffffffffffffb0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::startOnReservedThread(QRunnable *runnable)
{
    if (!runnable)
        return releaseThread();

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    Q_ASSERT(d->reservedThreads > 0);
    --d->reservedThreads;

    if (!d->tryStart(runnable)) {
        // This can only happen if we reserved max threads,
        // and something took the one minimum thread.
        d->enqueueTask(runnable, INT_MAX);
    }
}